

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O1

void parse_preproc_line(Source_File *src,Translation_Data *translation_data)

{
  KEYWORDS KVar1;
  token *__ptr;
  char *error_message;
  
  __ptr = get_next_token(src,chonky_jr,'\0');
  KVar1 = __ptr->type;
  free(__ptr);
  switch(KVar1) {
  case PKW_IF:
    parse_preproc_if_line(src,translation_data);
    return;
  case PKW_IFDEF:
    parse_preproc_ifdef_line(src,translation_data);
    return;
  case PKW_IFNDEF:
    parse_preproc_ifndef_line(src,translation_data);
    return;
  case PKW_ELIF:
    error_message = "unmatched elif";
    break;
  case PKW_ELSE:
    error_message = "unmatched else";
    break;
  case PKW_ENDIF:
    error_message = "unmatched endif";
    break;
  case PKW_INCLUDE:
    parse_include_line(src,translation_data);
    return;
  case PKW_DEFINE:
    parse_define_line(src,translation_data);
    return;
  case PKW_UNDEF:
    parse_preproc_undef_line(src,translation_data);
    return;
  case PKW_LINE:
    parse_preproc_line_line(src,translation_data);
    return;
  case PKW_ERROR:
    parse_preproc_error_line(src,translation_data);
    return;
  default:
    error_message = "expected a preprocessing directive";
  }
  push_lexing_error(error_message,src,translation_data);
  return;
}

Assistant:

void parse_preproc_line(struct Source_File *src,struct Translation_Data *translation_data)
{
	struct token *hold;
	hold=get_next_token(src,&chonky_jr[0],0);
	switch(hold->type)
	{
		case PKW_INCLUDE:
			free(hold);
			parse_include_line(src,translation_data);
			return;
		case PKW_DEFINE:
			free(hold);
			parse_define_line(src,translation_data);
			return;
		case PKW_IF:
			free(hold);
			parse_preproc_if_line(src,translation_data);
			return;
		case PKW_IFDEF:
			free(hold);
			parse_preproc_ifdef_line(src,translation_data);
			return;
		case PKW_IFNDEF:
			free(hold);
			parse_preproc_ifndef_line(src,translation_data);
			return;
		case PKW_UNDEF:
			free(hold);
			parse_preproc_undef_line(src,translation_data);
			return;
		case PKW_ENDIF:
			free(hold);
			push_lexing_error("unmatched endif",src,translation_data);
			return;
		case PKW_ELSE:
			free(hold);
			push_lexing_error("unmatched else",src,translation_data);
			return;
		case PKW_ELIF:
			free(hold);
			push_lexing_error("unmatched elif",src,translation_data);
			return;
		case PKW_LINE:
			free(hold);
			parse_preproc_line_line(src,translation_data);
			return;
		case PKW_ERROR:
			free(hold);
			parse_preproc_error_line(src,translation_data);
			return;
		default:
			/*TODO error*/
			free(hold);
			push_lexing_error("expected a preprocessing directive",src,translation_data);
			return;

	}
}